

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O3

bool crnlib::int_to_string(int value,char *pDst,uint len)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char buf [16];
  undefined8 uStack_30;
  byte abStack_28 [15];
  undefined1 local_19;
  
  uVar3 = (ulong)(uint)-value;
  if (0 < value) {
    uVar3 = (ulong)(uint)value;
  }
  local_19 = 0;
  lVar1 = 0xe;
  do {
    lVar4 = lVar1;
    uVar2 = (uint)uVar3;
    abStack_28[lVar4] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
    lVar1 = lVar4 + -1;
    uVar3 = uVar3 / 10;
  } while (9 < uVar2);
  if (value < 0) {
    abStack_28[lVar4 + -1] = 0x2d;
    lVar1 = lVar4 + -2;
  }
  lVar4 = lVar1 + -0xf;
  uVar3 = -lVar4;
  uVar5 = (ulong)len;
  if ((uVar3 < uVar5 || -uVar5 == lVar4) && lVar4 != 0) {
    uStack_30 = 0x147fe7;
    memcpy(pDst,abStack_28 + lVar1 + 1,uVar3);
  }
  return uVar3 < uVar5 || -uVar5 == lVar4;
}

Assistant:

bool int_to_string(int value, char* pDst, uint len)
    {
        CRNLIB_ASSERT(pDst);

        const uint cBufSize = 16;
        char buf[cBufSize];

        uint j = static_cast<uint>((value < 0) ? -value : value);

        char* p = buf + cBufSize - 1;

        *p-- = '\0';

        do
        {
            *p-- = static_cast<uint8>('0' + (j % 10));
            j /= 10;
        } while (j);

        if (value < 0)
        {
            *p-- = '-';
        }

        const size_t total_bytes = (buf + cBufSize - 1) - p;
        if (total_bytes > len)
        {
            return false;
        }

        for (size_t i = 0; i < total_bytes; i++)
        {
            pDst[i] = p[1 + i];
        }

        return true;
    }